

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLocalGet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index local)

{
  Type type;
  LocalGet *expr;
  string local_50 [39];
  allocator<char> local_29;
  
  if (this->func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"local.get is only valid in a function context",&local_29);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    type = Function::getLocalType(this->func,local);
    expr = Builder::makeLocalGet(&this->builder,local,type);
    push(this,(Expression *)expr);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLocalGet(Index local) {
  if (!func) {
    return Err{"local.get is only valid in a function context"};
  }
  push(builder.makeLocalGet(local, func->getLocalType(local)));
  return Ok{};
}